

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O3

void __thiscall Js::ScopeSlots::Set(ScopeSlots *this,uint i,Var value)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  WriteBarrierPtr<void> *pWVar4;
  
  pWVar4 = (this->slotArray).ptr;
  if (pWVar4->ptr <= (void *)(ulong)i) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0xdcc,"(i < GetCount())","i < GetCount()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pWVar4 = (this->slotArray).ptr;
  }
  pWVar4 = pWVar4 + (i + 2);
  Memory::Recycler::WBSetBit((char *)pWVar4);
  pWVar4->ptr = value;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar4);
  return;
}

Assistant:

void Set(uint i, Var value)
        {
            Assert(i < GetCount());
            slotArray[i + FirstSlotIndex] = value;
        }